

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void raspicam::_private::Private_Impl::video_buffer_callback
               (MMAL_PORT_T *port,MMAL_BUFFER_HEADER_T *buffer)

{
  MMAL_PORT_USERDATA_T *pMVar1;
  bool bVar2;
  MMAL_STATUS_T MVar3;
  MMAL_BUFFER_HEADER_T *in_RSI;
  MMAL_PORT_T *in_RDI;
  MMAL_STATUS_T status;
  unique_lock<std::mutex> lck;
  bool hasGrabbed;
  PORT_USERDATA *pData;
  MMAL_BUFFER_HEADER_T *new_buffer;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  MMAL_BUFFER_HEADER_T *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  membuf<unsigned_char> *in_stack_ffffffffffffffc0;
  
  pMVar1 = in_RDI->userdata;
  bVar2 = false;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((pMVar1 != (MMAL_PORT_USERDATA_T *)0x0) && (((byte)pMVar1[0x90] & 1) != 0)) &&
     (in_RSI->length != 0)) {
    mmal_buffer_header_mem_lock(in_RSI);
    membuf<unsigned_char>::resize
              (in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    memcpy(*(void **)(pMVar1 + 0x98),in_RSI->data,(ulong)in_RSI->length);
    pMVar1[0x90] = (MMAL_PORT_USERDATA_T)0x0;
    bVar2 = true;
    mmal_buffer_header_mem_unlock(in_RSI);
  }
  mmal_buffer_header_release(in_RSI);
  if ((in_RDI->is_enabled != 0) &&
     ((in_stack_ffffffffffffffb0 =
            mmal_queue_get((MMAL_QUEUE_T *)**(undefined8 **)(*(long *)pMVar1 + 0x18)),
      in_stack_ffffffffffffffb0 == (MMAL_BUFFER_HEADER_T *)0x0 ||
      (MVar3 = mmal_port_send_buffer(in_RDI,in_stack_ffffffffffffffb0), MVar3 != MMAL_SUCCESS)))) {
    printf("Unable to return a buffer to the encoder port");
  }
  if (*(int *)(*(long *)pMVar1 + 0x3c) != 0) {
    mmal_port_parameter_set_uint32
              (*(MMAL_PORT_T **)(*(long *)(*(long *)pMVar1 + 0x10) + 0x20),0x10043,
               *(uint32_t *)(*(long *)pMVar1 + 0x3c));
  }
  if (bVar2) {
    ThreadCondition::BroadCast((ThreadCondition *)0x10c55f);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void Private_Impl::video_buffer_callback ( MMAL_PORT_T *port, MMAL_BUFFER_HEADER_T *buffer ) {
            MMAL_BUFFER_HEADER_T *new_buffer;
            PORT_USERDATA *pData = ( PORT_USERDATA * ) port->userdata;

            bool hasGrabbed=false;
//            pData->_mutex.lock();
             std::unique_lock<std::mutex> lck ( pData->_mutex );
            if ( pData ) {
                if ( pData->wantToGrab &&  buffer->length ) {
                    mmal_buffer_header_mem_lock ( buffer );
                    pData->_buffData.resize ( buffer->length );
                    memcpy ( pData->_buffData.data,buffer->data,buffer->length );
                    pData->wantToGrab =false;
                    hasGrabbed=true;
                    mmal_buffer_header_mem_unlock ( buffer );
                }
            }
            //pData->_mutex.unlock();
           // if ( hasGrabbed ) pData->Thcond.BroadCast(); //wake up waiting client
            // release buffer back to the pool
            mmal_buffer_header_release ( buffer );
            // and send one back to the port (if still open)
            if ( port->is_enabled ) {
                MMAL_STATUS_T status;

                new_buffer = mmal_queue_get ( pData->pstate->video_pool->queue );

                if ( new_buffer )
                    status = mmal_port_send_buffer ( port, new_buffer );

                if ( !new_buffer || status != MMAL_SUCCESS )
                    printf ( "Unable to return a buffer to the encoder port" );
            }

            if ( pData->pstate->shutterSpeed!=0 )
                mmal_port_parameter_set_uint32 ( pData->pstate->camera_component->control, MMAL_PARAMETER_SHUTTER_SPEED, pData->pstate->shutterSpeed ) ;
            if ( hasGrabbed ) pData->Thcond.BroadCast(); //wake up waiting client

        }